

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-readable-nor-writable-on-read-error.c
# Opt level: O3

int run_test_not_readable_nor_writable_on_read_error(void)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in sa;
  uv_buf_t uStack_40;
  code *pcStack_30;
  long local_28;
  long local_20;
  sockaddr_in local_18;
  
  uStack_40.len = (size_t)uStack_40.base;
  pcStack_30 = (code *)0x1aaff7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_18);
  local_20 = (long)iVar1;
  local_28 = 0;
  if (local_20 == 0) {
    pcStack_30 = (code *)0x1ab021;
    iVar1 = uv_loop_init(&loop);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001ab1c7;
    pcStack_30 = (code *)0x1ab052;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001ab1d4;
    pcStack_30 = (code *)0x1ab08f;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,(sockaddr *)&local_18,connect_cb);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001ab1e1;
    pcStack_30 = (code *)0x1ab0bb;
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001ab1ee;
    local_20 = 1;
    local_28 = (long)connect_cb_called;
    if (local_28 != 1) goto LAB_001ab1fb;
    local_20 = 1;
    local_28 = (long)read_cb_called;
    if (local_28 != 1) goto LAB_001ab208;
    local_20 = 1;
    local_28 = (long)write_cb_called;
    if (local_28 != 1) goto LAB_001ab215;
    local_20 = 1;
    local_28 = (long)close_cb_called;
    if (local_28 != 1) goto LAB_001ab222;
    pcStack_30 = (code *)0x1ab17d;
    uv_walk(&loop,close_walk_cb,(void *)0x0);
    pcStack_30 = (code *)0x1ab187;
    uv_run(&loop,UV_RUN_DEFAULT);
    local_20 = 0;
    pcStack_30 = (code *)0x1ab198;
    iVar1 = uv_loop_close(&loop);
    local_28 = (long)iVar1;
    if (local_20 == local_28) {
      pcStack_30 = (code *)0x1ab1b2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x1ab1c7;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001ab1c7:
    pcStack_30 = (code *)0x1ab1d4;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001ab1d4:
    pcStack_30 = (code *)0x1ab1e1;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001ab1e1:
    pcStack_30 = (code *)0x1ab1ee;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001ab1ee:
    pcStack_30 = (code *)0x1ab1fb;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001ab1fb:
    pcStack_30 = (code *)0x1ab208;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001ab208:
    pcStack_30 = (code *)0x1ab215;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001ab215:
    pcStack_30 = (code *)0x1ab222;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001ab222:
    pcStack_30 = (code *)0x1ab22f;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  iVar1 = (int)&local_28;
  pcStack_30 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  uStack_40.base = (char *)(long)iVar1;
  if ((char *)(long)iVar1 == (char *)0x0) {
    iVar1 = uv_read_start((uv_stream_t *)&tcp_client,alloc_cb,read_cb);
    uStack_40.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 == (char *)0x0) {
      uStack_40 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_client,&uStack_40,1,write_cb);
      pcStack_30 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001ab31b;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001ab31b:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x3893e0;
}

Assistant:

TEST_IMPL(not_readable_nor_writable_on_read_error) {
  struct sockaddr_in sa;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &sa));
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_tcp_init(&loop, &tcp_client));

  ASSERT_OK(uv_tcp_connect(&connect_req,
                           &tcp_client,
                           (const struct sockaddr*) &sa,
                           connect_cb));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}